

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::create_torrent::create_torrent
          (create_torrent *this,file_storage *fs,int piece_size,create_flags_t flags)

{
  pointer this_00;
  int iVar1;
  int in_R8D;
  span<const_libtorrent::create_file_entry> files;
  vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> vStack_f8;
  file_storage local_e0;
  
  anon_unknown_40::convert_file_storage(&vStack_f8,fs);
  create_torrent(this,&vStack_f8,piece_size,flags);
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  ~vector(&vStack_f8);
  this_00 = (this->m_files).
            super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
            .
            super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  files.m_ptr = ((long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) *
                0x2e8ba2e8ba2e8ba3;
  files.m_len._0_4_ = this->m_piece_length;
  files.m_len._4_4_ = 0;
  anon_unknown_40::make_file_storage(&local_e0,(anon_unknown_40 *)this_00,files,in_R8D);
  file_storage::operator=(fs,&local_e0);
  file_storage::~file_storage(&local_e0);
  iVar1 = this->m_num_pieces;
  fs->m_piece_length = this->m_piece_length;
  fs->m_num_pieces = iVar1;
  return;
}

Assistant:

create_torrent::create_torrent(file_storage& fs, int piece_size
		, create_flags_t const flags)
		: create_torrent(convert_file_storage(fs), piece_size, flags)
	{
		// for backwards compatibility
		fs = make_file_storage(m_files, m_piece_length);
		fs.set_num_pieces(m_num_pieces);
		fs.set_piece_length(m_piece_length);
	}